

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.cpp
# Opt level: O3

Output * anon_unknown.dwarf_9a77::generate_output
                   (Output *__return_storage_ptr__,Manifest *manifest,Target *target,
                   xml_document *spec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  xml_node_struct *pxVar2;
  bool bVar3;
  int iVar4;
  const_iterator pxVar5;
  const_iterator pxVar6;
  char *pcVar7;
  size_t sVar8;
  const_iterator cVar9;
  char_t *pcVar10;
  pointer pFVar11;
  pointer pFVar12;
  Output *extraout_RAX;
  _Base_ptr t1;
  _Alloc_hider _Var13;
  char *__s;
  string boolean_name;
  xpath_node ref_1;
  xml_node cn;
  xpath_node ref;
  string pointer_name;
  xpath_node ref_2;
  xml_node in_stack_fffffffffffffdf0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  string local_1f0;
  pointer local_1d0;
  _Base_ptr local_1c8;
  pointer local_1c0;
  Output *local_1b8;
  Manifest *local_1b0;
  xml_document *local_1a8;
  string *local_1a0;
  string *local_198;
  xpath_node_set local_190;
  undefined1 local_168 [32];
  Target *local_148;
  xml_node local_140;
  undefined1 local_138 [32];
  string local_118;
  string local_f8;
  string local_d8;
  string *local_b8;
  undefined1 local_b0 [32];
  xml_node local_90;
  undefined1 local_88 [32];
  xpath_node local_68;
  xml_named_node_iterator local_58;
  xml_named_node_iterator local_48;
  
  (__return_storage_ptr__->api_name).super_string._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->api_name).super_string.field_2;
  (__return_storage_ptr__->api_name).super_string._M_string_length = 0;
  (__return_storage_ptr__->api_name).super_string.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->type_typedefs).super_string._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->type_typedefs).super_string.field_2;
  (__return_storage_ptr__->type_typedefs).super_string._M_string_length = 0;
  (__return_storage_ptr__->type_typedefs).super_string.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->enum_definitions).super_string._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->enum_definitions).super_string.field_2;
  (__return_storage_ptr__->enum_definitions).super_string._M_string_length = 0;
  (__return_storage_ptr__->enum_definitions).super_string.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->ext_macros).super_string._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->ext_macros).super_string.field_2;
  (__return_storage_ptr__->ext_macros).super_string._M_string_length = 0;
  (__return_storage_ptr__->ext_macros).super_string.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->ver_macros).super_string._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->ver_macros).super_string.field_2;
  (__return_storage_ptr__->ver_macros).super_string._M_string_length = 0;
  (__return_storage_ptr__->ver_macros).super_string.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->ext_declarations).super_string._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->ext_declarations).super_string.field_2;
  (__return_storage_ptr__->ext_declarations).super_string._M_string_length = 0;
  (__return_storage_ptr__->ext_declarations).super_string.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->ver_declarations).super_string._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->ver_declarations).super_string.field_2;
  (__return_storage_ptr__->ver_declarations).super_string._M_string_length = 0;
  (__return_storage_ptr__->ver_declarations).super_string.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->ext_definitions).super_string._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->ext_definitions).super_string.field_2;
  (__return_storage_ptr__->ext_definitions).super_string._M_string_length = 0;
  (__return_storage_ptr__->ext_definitions).super_string.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->ver_definitions).super_string._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->ver_definitions).super_string.field_2;
  (__return_storage_ptr__->ver_definitions).super_string._M_string_length = 0;
  (__return_storage_ptr__->ver_definitions).super_string.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->ver_loaders).super_string._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->ver_loaders).super_string.field_2;
  (__return_storage_ptr__->ver_loaders).super_string._M_string_length = 0;
  (__return_storage_ptr__->ver_loaders).super_string.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->ext_loaders).super_string._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->ext_loaders).super_string.field_2;
  (__return_storage_ptr__->ext_loaders).super_string._M_string_length = 0;
  (__return_storage_ptr__->ext_loaders).super_string.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->cmd_typedefs).super_string._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->cmd_typedefs).super_string.field_2;
  (__return_storage_ptr__->cmd_typedefs).super_string._M_string_length = 0;
  (__return_storage_ptr__->cmd_typedefs).super_string.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->cmd_declarations).super_string._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->cmd_declarations).super_string.field_2;
  (__return_storage_ptr__->cmd_declarations).super_string._M_string_length = 0;
  (__return_storage_ptr__->cmd_declarations).super_string.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->cmd_macros).super_string._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->cmd_macros).super_string.field_2;
  (__return_storage_ptr__->cmd_macros).super_string._M_string_length = 0;
  (__return_storage_ptr__->cmd_macros).super_string.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->cmd_definitions).super_string._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->cmd_definitions).super_string.field_2;
  (__return_storage_ptr__->cmd_definitions).super_string._M_string_length = 0;
  (__return_storage_ptr__->cmd_definitions).super_string.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->cmd_loaders).super_string._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->cmd_loaders).super_string.field_2;
  (__return_storage_ptr__->cmd_loaders).super_string._M_string_length = 0;
  (__return_storage_ptr__->cmd_loaders).super_string.field_2._M_local_buf[0] = '\0';
  local_1b0 = manifest;
  local_1a8 = spec;
  iVar4 = std::__cxx11::string::compare((char *)target);
  local_1b8 = __return_storage_ptr__;
  if (iVar4 == 0) {
    wire::string::operator=(&__return_storage_ptr__->api_name,(char (*) [7])"OpenGL");
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)target);
    if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)target), iVar4 == 0)) {
      wire::string::operator=(&local_1b8->api_name,(char (*) [10])"OpenGL ES");
    }
  }
  t1 = (_Base_ptr)
       (local_1b0->extensions).super__Vector_base<wire::string,_std::allocator<wire::string>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1c0 = (pointer)(local_1b0->extensions).
                       super__Vector_base<wire::string,_std::allocator<wire::string>_>._M_impl.
                       super__Vector_impl_data._M_finish;
  local_148 = target;
  if ((pointer)t1 != local_1c0) {
    local_1c8 = (_Base_ptr)&local_1b8->ext_macros;
    local_1d0 = (pointer)&local_1b8->ext_declarations;
    local_198 = &local_1b8->ext_definitions;
    local_1a0 = &local_1b8->ext_loaders;
    paVar1 = &local_1f0.field_2;
    do {
      local_190._0_8_ = (long)&local_190 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,*(long *)&t1->_M_color,
                 (long)&t1->_M_parent->_M_color + *(long *)&t1->_M_color);
      _Var13._M_p = (pointer)&local_208;
      std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffde8,"GL_","");
      bVar3 = wire::string::starts_with((string *)&local_190,(string *)&stack0xfffffffffffffde8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var13._M_p != &local_208) {
        operator_delete(_Var13._M_p);
      }
      if (bVar3) {
        std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x3,0x125361);
      }
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"#define \x01 1\n","");
      wire::string::string<wire::string>((string *)&stack0xfffffffffffffde8,&local_1f0,(string *)t1)
      ;
      wire::string::operator<<((string *)local_1c8,(string *)&stack0xfffffffffffffde8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var13._M_p != &local_208) {
        operator_delete(_Var13._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"extern int \x01;\n","");
      wire::string::string<wire::string>
                ((string *)&stack0xfffffffffffffde8,&local_1f0,(string *)&local_190);
      wire::string::operator<<(&local_1d0->name,(string *)&stack0xfffffffffffffde8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var13._M_p != &local_208) {
        operator_delete(_Var13._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,"GREGDEF int \x01 = 0;\n","");
      wire::string::string<wire::string>
                ((string *)&stack0xfffffffffffffde8,&local_1f0,(string *)&local_190);
      wire::string::operator<<(local_198,(string *)&stack0xfffffffffffffde8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var13._M_p != &local_208) {
        operator_delete(_Var13._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,"    \x01 = gregExtensionSupported(\"\x02\");\n","");
      wire::string::string<wire::string,wire::string>
                ((string *)&stack0xfffffffffffffde8,&local_1f0,(string *)&local_190,(string *)t1);
      wire::string::operator<<(local_1a0,(string *)&stack0xfffffffffffffde8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var13._M_p != &local_208) {
        operator_delete(_Var13._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      if (local_190._0_8_ != (long)&local_190 + 0x10U) {
        operator_delete((void *)local_190._0_8_);
      }
      t1 = t1 + 1;
    } while ((pointer)t1 != local_1c0);
  }
  pFVar11 = (local_1b0->features).
            super__Vector_base<(anonymous_namespace)::Feature,_std::allocator<(anonymous_namespace)::Feature>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1c0 = (local_1b0->features).
              super__Vector_base<(anonymous_namespace)::Feature,_std::allocator<(anonymous_namespace)::Feature>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar11 != local_1c0) {
    local_1c8 = (_Base_ptr)&local_1b8->ver_macros;
    local_1d0 = (pointer)&local_1b8->ver_declarations;
    local_198 = &local_1b8->ver_definitions;
    local_1a0 = &local_1b8->ver_loaders;
    paVar1 = &local_1f0.field_2;
    do {
      local_190._0_8_ = (long)&local_190 + 0x10;
      pxVar2 = (xml_node_struct *)(pFVar11->name).super_string._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,pxVar2,
                 (long)&pxVar2->header + (pFVar11->name).super_string._M_string_length);
      _Var13._M_p = (pointer)&local_208;
      std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffde8,"GL_","");
      bVar3 = wire::string::starts_with((string *)&local_190,(string *)&stack0xfffffffffffffde8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var13._M_p != &local_208) {
        operator_delete(_Var13._M_p);
      }
      if (bVar3) {
        std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x3,0x125361);
      }
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"#define \x01 1\n","");
      wire::string::string<wire::string>
                ((string *)&stack0xfffffffffffffde8,&local_1f0,&pFVar11->name);
      wire::string::operator<<((string *)local_1c8,(string *)&stack0xfffffffffffffde8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var13._M_p != &local_208) {
        operator_delete(_Var13._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"extern int \x01;\n","");
      wire::string::string<wire::string>
                ((string *)&stack0xfffffffffffffde8,&local_1f0,(string *)&local_190);
      wire::string::operator<<(&local_1d0->name,(string *)&stack0xfffffffffffffde8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var13._M_p != &local_208) {
        operator_delete(_Var13._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,"GREGDEF int \x01 = 0;\n","");
      wire::string::string<wire::string>
                ((string *)&stack0xfffffffffffffde8,&local_1f0,(string *)&local_190);
      wire::string::operator<<(local_198,(string *)&stack0xfffffffffffffde8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var13._M_p != &local_208) {
        operator_delete(_Var13._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,"    \x01 = gregVersionSupported(\x02, \x03);\n","");
      wire::string::string<wire::string,unsigned_int,unsigned_int>
                ((string *)&stack0xfffffffffffffde8,&local_1f0,(string *)&local_190,
                 &(pFVar11->version).major,&(pFVar11->version).minor);
      wire::string::operator<<(local_1a0,(string *)&stack0xfffffffffffffde8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var13._M_p != &local_208) {
        operator_delete(_Var13._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      if (local_190._0_8_ != (long)&local_190 + 0x10U) {
        operator_delete((void *)local_190._0_8_);
      }
      pFVar11 = pFVar11 + 1;
    } while (pFVar11 != local_1c0);
  }
  pugi::xml_node::select_nodes
            (&local_190,&local_1a8->super_xml_node,"/registry/types/type",(xpath_variable_set *)0x0)
  ;
  pxVar5 = pugi::xpath_node_set::begin(&local_190);
  pxVar6 = pugi::xpath_node_set::end(&local_190);
  if (pxVar5 != pxVar6) {
    local_1d0 = (pointer)&local_1b8->type_typedefs;
    local_1c0 = (pointer)&local_1b0->types;
    local_1c8 = &(local_1b0->types)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      local_138._0_8_ = (pxVar5->_node)._root;
      local_138._8_8_ = (pxVar5->_attribute)._attr;
      pugi::xpath_node::node((xpath_node *)local_138);
      pcVar7 = type_name(in_stack_fffffffffffffdf0);
      __s = "";
      if (pcVar7 != (char *)0x0) {
        __s = pcVar7;
      }
      _Var13._M_p = (pointer)&local_208;
      sVar8 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffde8,__s,__s + sVar8);
      cVar9 = std::
              _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
              ::find((_Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
                      *)local_1c0,(key_type *)&stack0xfffffffffffffde8);
      if (cVar9._M_node == local_1c8) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var13._M_p != &local_208) {
LAB_0010e357:
          operator_delete(_Var13._M_p);
        }
      }
      else {
        api_name(in_stack_fffffffffffffdf0);
        iVar4 = std::__cxx11::string::compare((char *)local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var13._M_p != &local_208) {
          operator_delete(_Var13._M_p);
        }
        if (iVar4 == 0) {
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"\x01\n","");
          scrape_type_text((xml_node)_Var13._M_p);
          wire::string::string<wire::string>
                    ((string *)&stack0xfffffffffffffde8,&local_1f0,(string *)local_168);
          wire::string::operator<<(&local_1d0->name,(string *)&stack0xfffffffffffffde8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var13._M_p != &local_208) {
            operator_delete(_Var13._M_p);
          }
          if ((xml_node_struct *)local_168._0_8_ != (xml_node_struct *)(local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_);
          }
          _Var13._M_p = local_1f0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) goto LAB_0010e357;
        }
      }
      pxVar5 = pxVar5 + 1;
    } while (pxVar5 != pxVar6);
  }
  pugi::xpath_node_set::~xpath_node_set(&local_190);
  pugi::xml_node::select_nodes
            (&local_190,&local_1a8->super_xml_node,"/registry/enums/enum",(xpath_variable_set *)0x0)
  ;
  pxVar5 = pugi::xpath_node_set::begin(&local_190);
  pxVar6 = pugi::xpath_node_set::end(&local_190);
  if (pxVar5 != pxVar6) {
    local_1d0 = (pointer)&local_1b8->enum_definitions;
    local_1c0 = (pointer)&local_1b0->enums;
    local_1c8 = &(local_1b0->enums)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      local_168._0_8_ = (pxVar5->_node)._root;
      local_168._8_8_ = (pxVar5->_attribute)._attr;
      local_138._0_8_ = pugi::xpath_node::node((xpath_node *)local_168);
      local_1f0._M_dataplus._M_p = (pointer)pugi::xml_node::attribute((xml_node *)local_138,"name");
      pcVar10 = pugi::xml_attribute::value((xml_attribute *)&local_1f0);
      if (pcVar10 == (char_t *)0x0) {
        pcVar10 = "";
      }
      _Var13._M_p = (pointer)&local_208;
      sVar8 = strlen(pcVar10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffde8,pcVar10,pcVar10 + sVar8);
      cVar9 = std::
              _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
              ::find((_Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
                      *)local_1c0,(key_type *)&stack0xfffffffffffffde8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var13._M_p != &local_208) {
        operator_delete(_Var13._M_p);
      }
      if (cVar9._M_node != local_1c8) {
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1f0,"#define \x01 \x02\n","");
        local_88._0_8_ = pugi::xml_node::attribute((xml_node *)local_138,"name");
        local_f8.super_string._M_dataplus._M_p =
             pugi::xml_attribute::value((xml_attribute *)local_88);
        local_b0._0_8_ = pugi::xml_node::attribute((xml_node *)local_138,"value");
        local_d8._M_dataplus._M_p = pugi::xml_attribute::value((xml_attribute *)local_b0);
        wire::string::string<char_const*,char_const*>
                  ((string *)&stack0xfffffffffffffde8,&local_1f0,(char **)&local_f8,
                   (char **)&local_d8);
        wire::string::operator<<(&local_1d0->name,(string *)&stack0xfffffffffffffde8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var13._M_p != &local_208) {
          operator_delete(_Var13._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
      }
      pxVar5 = pxVar5 + 1;
    } while (pxVar5 != pxVar6);
  }
  pugi::xpath_node_set::~xpath_node_set(&local_190);
  pugi::xml_node::select_nodes
            (&local_190,&local_1a8->super_xml_node,"/registry/commands/command",
             (xpath_variable_set *)0x0);
  pFVar11 = (pointer)pugi::xpath_node_set::begin(&local_190);
  pFVar12 = (pointer)pugi::xpath_node_set::end(&local_190);
  if (pFVar11 != pFVar12) {
    local_198 = &local_1b8->cmd_typedefs;
    local_1a0 = &local_1b8->cmd_declarations;
    local_148 = (Target *)&local_1b8->cmd_macros;
    local_1a8 = (xml_document *)&local_1b8->cmd_definitions;
    local_b8 = &local_1b8->cmd_loaders;
    local_1c8 = (_Base_ptr)&local_1b0->commands;
    local_1b0 = (Manifest *)&(local_1b0->commands)._M_t._M_impl.super__Rb_tree_header;
    paVar1 = &local_1f0.field_2;
    local_1d0 = pFVar12;
    do {
      local_68._node._root = (xml_node_struct *)(pFVar11->name).super_string._M_dataplus._M_p;
      local_68._attribute._attr =
           (xml_attribute_struct *)(pFVar11->name).super_string._M_string_length;
      local_1c0 = pFVar11;
      local_140 = pugi::xpath_node::node(&local_68);
      pugi::xml_node::child(&local_140,"proto");
      pcVar10 = pugi::xml_node::child_value((xml_node *)&stack0xfffffffffffffde8,"name");
      if (pcVar10 == (char_t *)0x0) {
        pcVar10 = "";
      }
      local_168._0_8_ = local_168 + 0x10;
      sVar8 = strlen(pcVar10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_168,pcVar10,pcVar10 + sVar8);
      cVar9 = std::
              _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
              ::find(local_1c8,(key_type *)local_168);
      if ((Manifest *)cVar9._M_node != local_1b0) {
        _Var13._M_p = (pointer)&local_208;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffde8,"PFN\x01PROC","");
        wire::string::uppercase((string *)&local_1f0,(string *)local_168);
        wire::string::string<wire::string>
                  ((string *)local_138,(string *)&stack0xfffffffffffffde8,(string *)&local_1f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var13._M_p != &local_208) {
          operator_delete(_Var13._M_p);
        }
        _Var13._M_p = (pointer)&local_208;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffde8,"greg_\x01","");
        wire::string::string<wire::string>
                  (&local_f8,(string *)&stack0xfffffffffffffde8,(string *)local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var13._M_p != &local_208) {
          operator_delete(_Var13._M_p);
        }
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,"typedef \x01 (GLAPIENTRY *\x02)(\x03);\n","");
        pugi::xml_node::child(&local_140,"proto");
        scrape_proto_text((xml_node)_Var13._M_p);
        local_90._root = local_140._root;
        local_118.super_string._M_dataplus._M_p = (pointer)&local_118.super_string.field_2;
        local_118.super_string._M_string_length = 0;
        local_118.super_string.field_2._M_local_buf[0] = '\0';
        pugi::xml_node::children
                  ((xml_object_range<pugi::xml_named_node_iterator> *)&stack0xfffffffffffffde8,
                   &local_90,"param");
        local_58._node._root = (xml_node_struct *)local_208._M_allocated_capacity;
        local_58._name = (char_t *)local_208._8_8_;
        local_48._node._root = (xml_node_struct *)_Var13._M_p;
        while (bVar3 = pugi::xml_named_node_iterator::operator!=(&local_48,&local_58), bVar3) {
          pugi::xml_named_node_iterator::operator*(&local_48);
          if (local_118.super_string._M_string_length != 0) {
            wire::string::operator<<(&local_118,(char (*) [3])", ");
          }
          scrape_proto_text((xml_node)_Var13._M_p);
          wire::string::operator<<(&local_118,(string *)&local_1f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != paVar1) {
            operator_delete(local_1f0._M_dataplus._M_p);
          }
          pugi::xml_named_node_iterator::operator++(&local_48);
        }
        if (local_118.super_string._M_string_length == 0) {
          wire::string::operator=(&local_118,(char (*) [5])"void");
        }
        wire::string::string<wire::string,wire::string,wire::string>
                  ((string *)local_88,&local_d8,(string *)local_b0,(string *)local_138,&local_118);
        wire::string::operator<<(local_198,(string *)local_88);
        if ((xml_attribute_struct *)local_88._0_8_ != (xml_attribute_struct *)(local_88 + 0x10)) {
          operator_delete((void *)local_88._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118.super_string._M_dataplus._M_p != &local_118.super_string.field_2) {
          operator_delete(local_118.super_string._M_dataplus._M_p);
        }
        if ((xml_attribute_struct *)local_b0._0_8_ != (xml_attribute_struct *)(local_b0 + 0x10)) {
          operator_delete((void *)local_b0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        local_1f0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1f0,"extern \x01 \x02;\n","");
        wire::string::string<wire::string,wire::string>
                  ((string *)&stack0xfffffffffffffde8,&local_1f0,(string *)local_138,&local_f8);
        wire::string::operator<<(local_1a0,(string *)&stack0xfffffffffffffde8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var13._M_p != &local_208) {
          operator_delete(_Var13._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        local_1f0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1f0,"#define \x01 \x02\n","");
        wire::string::string<wire::string,wire::string>
                  ((string *)&stack0xfffffffffffffde8,&local_1f0,(string *)local_168,&local_f8);
        wire::string::operator<<(&local_148->api,(string *)&stack0xfffffffffffffde8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var13._M_p != &local_208) {
          operator_delete(_Var13._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        local_1f0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1f0,"GREGDEF \x01 \x02 = NULL;\n","");
        wire::string::string<wire::string,wire::string>
                  ((string *)&stack0xfffffffffffffde8,&local_1f0,(string *)local_138,&local_f8);
        wire::string::operator<<((string *)local_1a8,(string *)&stack0xfffffffffffffde8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var13._M_p != &local_208) {
          operator_delete(_Var13._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        local_1f0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1f0,"    \x01 = (\x02) gregGetProcAddress(\"\x03\");\n","");
        wire::string::string<wire::string,wire::string,wire::string>
                  ((string *)&stack0xfffffffffffffde8,&local_1f0,&local_f8,(string *)local_138,
                   (string *)local_168);
        wire::string::operator<<(local_b8,(string *)&stack0xfffffffffffffde8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var13._M_p != &local_208) {
          operator_delete(_Var13._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.super_string._M_dataplus._M_p != &local_f8.super_string.field_2) {
          operator_delete(local_f8.super_string._M_dataplus._M_p);
        }
        if ((xml_node_struct *)local_138._0_8_ != (xml_node_struct *)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_);
        }
      }
      if ((xml_node_struct *)local_168._0_8_ != (xml_node_struct *)(local_168 + 0x10)) {
        operator_delete((void *)local_168._0_8_);
      }
      pFVar11 = (pointer)&(local_1c0->name).super_string.field_2;
    } while (pFVar11 != local_1d0);
  }
  pugi::xpath_node_set::~xpath_node_set(&local_190);
  return extraout_RAX;
}

Assistant:

Output generate_output(const Manifest& manifest,
                       const Target& target,
                       const pugi::xml_document& spec)
{
  Output output;

  if (target.api == "gl")
    output.api_name = "OpenGL";
  else if (target.api == "gles1" || target.api == "gles2")
    output.api_name = "OpenGL ES";

  for (const wire::string& extension : manifest.extensions)
  {
    wire::string boolean_name = extension;
    if (boolean_name.starts_with("GL_"))
      boolean_name.replace(0, 3, "GREG_");

    output.ext_macros += wire::string("#define \1 1\n", extension);
    output.ext_declarations += wire::string("extern int \1;\n", boolean_name);
    output.ext_definitions += wire::string("GREGDEF int \1 = 0;\n", boolean_name);
    output.ext_loaders += wire::string("    \1 = gregExtensionSupported(\"\2\");\n",
                                       boolean_name,
                                       extension);
  }

  for (const Feature& feature : manifest.features)
  {
    wire::string boolean_name = feature.name;
    if (boolean_name.starts_with("GL_"))
      boolean_name.replace(0, 3, "GREG_");

    output.ver_macros += wire::string("#define \1 1\n", feature.name);
    output.ver_declarations += wire::string("extern int \1;\n", boolean_name);
    output.ver_definitions += wire::string("GREGDEF int \1 = 0;\n", boolean_name);
    output.ver_loaders += wire::string("    \1 = gregVersionSupported(\2, \3);\n",
                                       boolean_name,
                                       feature.version.major,
                                       feature.version.minor);
  }

  for (const auto ref : spec.select_nodes("/registry/types/type"))
  {
    const pugi::xml_node tn = ref.node();

    if (!manifest.types.count(type_name(tn)) || api_name(tn) != target.api)
      continue;

    output.type_typedefs += wire::string("\1\n", scrape_type_text(tn));
  }

  for (const auto ref : spec.select_nodes("/registry/enums/enum"))
  {
    const pugi::xml_node en = ref.node();

    if (!manifest.enums.count(en.attribute("name").value()))
      continue;

    output.enum_definitions += wire::string("#define \1 \2\n",
                                            en.attribute("name").value(),
                                            en.attribute("value").value());
  }

  for (const auto ref : spec.select_nodes("/registry/commands/command"))
  {
    const pugi::xml_node cn = ref.node();

    const wire::string function_name = cn.child("proto").child_value("name");
    if (!manifest.commands.count(function_name))
      continue;

    const wire::string typedef_name("PFN\1PROC", function_name.uppercase());
    const wire::string pointer_name("greg_\1", function_name);

    output.cmd_typedefs += wire::string("typedef \1 (GLAPIENTRY *\2)(\3);\n",
                                        scrape_proto_text(cn.child("proto")),
                                        typedef_name,
                                        command_params(cn));
    output.cmd_declarations += wire::string("extern \1 \2;\n",
                                            typedef_name,
                                            pointer_name);
    output.cmd_macros += wire::string("#define \1 \2\n",
                                      function_name,
                                      pointer_name);
    output.cmd_definitions += wire::string("GREGDEF \1 \2 = NULL;\n",
                                           typedef_name,
                                           pointer_name);
    output.cmd_loaders += wire::string("    \1 = (\2) gregGetProcAddress(\"\3\");\n",
                                       pointer_name,
                                       typedef_name,
                                       function_name);
  }

  return output;
}